

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

void __thiscall
embree::motion_derivative_regression_test::motion_derivative_regression_test
          (motion_derivative_regression_test *this,char *name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  RegressionTest *in_stack_ffffffffffffffb8;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  std::__cxx11::string::string((string *)&local_40,name,(allocator *)&stack0xffffffffffffffbf);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02185b78
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_02189ce0;
  (this->rng)._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar4 = 0x1571;
  lVar2 = 6;
  do {
    lVar3 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d;
    uVar4 = lVar3 + lVar1;
    (this->rng)._M_x[lVar2 + -5] = (lVar2 + lVar3) - 5;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13d);
  (this->rng)._M_p = 0x138;
  registerRegressionTest(in_stack_ffffffffffffffb8);
  return;
}

Assistant:

motion_derivative_regression_test(const char* name) : RegressionTest(name) {
      registerRegressionTest(this);
    }